

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fBufferMapTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Functional::BufferMapExplicitFlushCase::iterate(BufferMapExplicitFlushCase *this)

{
  RenderContext *renderCtx;
  deUint32 seed;
  deUint32 buffer;
  GLenum GVar1;
  deBool dVar2;
  uint uVar3;
  char *pcVar4;
  TestLog *log;
  deUint8 *pdVar5;
  void *dst;
  TestError *this_00;
  uint uVar6;
  bool bVar7;
  int local_84;
  void *ptr;
  bool isOk;
  int sliceBSize;
  int sliceBOffs;
  int sliceASize;
  int sliceAOffs;
  int mapSize;
  int mapOffset;
  int bufferSize;
  BufferVerifier local_38;
  BufferVerifier verifier;
  ReferenceBuffer refBuf;
  deUint32 buf;
  deUint32 dataSeed;
  BufferMapExplicitFlushCase *this_local;
  
  pcVar4 = tcu::TestNode::getName((TestNode *)this);
  seed = deStringHash(pcVar4);
  deqp::gls::BufferTestUtil::ReferenceBuffer::ReferenceBuffer((ReferenceBuffer *)&verifier);
  renderCtx = (this->super_BufferCase).m_renderCtx;
  log = tcu::TestContext::getLog((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::BufferTestUtil::BufferVerifier::BufferVerifier(&local_38,renderCtx,log,this->m_verify);
  uVar3 = (uint)((this->m_partialWrite & 1U) != 0);
  uVar6 = 0x1d9;
  if ((this->m_partialWrite & 1U) != 0) {
    uVar6 = 0x60;
  }
  if ((this->m_partialWrite & 1U) == 0) {
    local_84 = uVar3 + uVar6;
  }
  else {
    local_84 = 0x1f7;
  }
  deqp::gls::BufferTestUtil::ReferenceBuffer::setSize((ReferenceBuffer *)&verifier,0x514);
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar5,0x514,seed);
  buffer = deqp::gls::BufferTestUtil::BufferCase::genBuffer(&this->super_BufferCase);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,buffer);
  GVar1 = this->m_bufferTarget;
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_BufferCase).super_CallLogWrapper,GVar1,0x514,pdVar5,this->m_usage);
  pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,200);
  deqp::gls::BufferTestUtil::fillWithRandomBytes(pdVar5,0x3f3,seed & 0xabcdef);
  dst = glu::CallLogWrapper::glMapBufferRange
                  (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,200,0x3f3,
                   0x12);
  GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
  glu::checkError(GVar1,"glMapBufferRange",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                  ,0x171);
  while ((dVar2 = ::deGetFalse(), dVar2 == 0 && (dst != (void *)0x0))) {
    dVar2 = ::deGetFalse();
    if (dVar2 == 0) {
      pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,200);
      ::deMemcpy(dst,pdVar5,0x3f3);
      glu::CallLogWrapper::glFlushMappedBufferRange
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,
                 (long)(int)uVar3,(long)(int)uVar6);
      GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar1,"glFlushMappedBufferRange",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x177);
      glu::CallLogWrapper::glFlushMappedBufferRange
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget,(long)local_84,
                 (long)(int)(0x3f3U - local_84));
      GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar1,"glFlushMappedBufferRange",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x179);
      glu::CallLogWrapper::glUnmapBuffer
                (&(this->super_BufferCase).super_CallLogWrapper,this->m_bufferTarget);
      GVar1 = glu::CallLogWrapper::glGetError(&(this->super_BufferCase).super_CallLogWrapper);
      glu::checkError(GVar1,"glUnmapBuffer",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
                      ,0x17c);
      if ((this->m_partialWrite & 1U) == 0) {
        pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
        uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                          (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar5,200,(uchar *)0x3f3,
                           (ulong)this->m_bufferTarget);
        bVar7 = (uVar3 & 1) != 0;
      }
      else {
        pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
        uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                          (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar5,(ulong)(uVar3 + 200),
                           (uchar *)(ulong)uVar6,(ulong)this->m_bufferTarget);
        bVar7 = (uVar3 & 1) != 0;
        pdVar5 = deqp::gls::BufferTestUtil::ReferenceBuffer::getPtr((ReferenceBuffer *)&verifier,0);
        uVar3 = deqp::gls::BufferTestUtil::BufferVerifier::verify
                          (&local_38,(EVP_PKEY_CTX *)(ulong)buffer,pdVar5,(ulong)(local_84 + 200),
                           (uchar *)(ulong)(0x3f3U - local_84),(ulong)this->m_bufferTarget);
        if ((uVar3 & 1) == 0) {
          bVar7 = false;
        }
      }
      deqp::gls::BufferTestUtil::BufferCase::deleteBuffer(&this->super_BufferCase,buffer);
      pcVar4 = "Buffer verification failed";
      if (bVar7 != false) {
        pcVar4 = "Pass";
      }
      tcu::TestContext::setTestResult
                ((this->super_BufferCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar7
                 ,pcVar4);
      deqp::gls::BufferTestUtil::BufferVerifier::~BufferVerifier(&local_38);
      deqp::gls::BufferTestUtil::ReferenceBuffer::~ReferenceBuffer((ReferenceBuffer *)&verifier);
      return STOP;
    }
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fBufferMapTests.cpp"
             ,0x172);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

IterateResult iterate (void)
	{
		deUint32		dataSeed		= deStringHash(getName());
		deUint32		buf				= 0;
		ReferenceBuffer	refBuf;
		BufferVerifier	verifier		(m_renderCtx, m_testCtx.getLog(), m_verify);
		const int		bufferSize		= 1300;
		const int		mapOffset		= 200;
		const int		mapSize			= 1011;
		const int		sliceAOffs		= m_partialWrite ? 1		: 0;
		const int		sliceASize		= m_partialWrite ? 96		: 473;
		const int		sliceBOffs		= m_partialWrite ? 503		: sliceAOffs+sliceASize;
		const int		sliceBSize		= mapSize-sliceBOffs;
		bool			isOk			= true;

		// Setup reference data.
		refBuf.setSize(bufferSize);
		fillWithRandomBytes(refBuf.getPtr(), bufferSize, dataSeed);

		buf = genBuffer();
		glBindBuffer(m_bufferTarget, buf);
		glBufferData(m_bufferTarget, bufferSize, refBuf.getPtr(), m_usage);

		// Do reference map.
		fillWithRandomBytes(refBuf.getPtr(mapOffset), mapSize, dataSeed&0xabcdef);

		void* ptr = glMapBufferRange(m_bufferTarget, mapOffset, mapSize, GL_MAP_WRITE_BIT|GL_MAP_FLUSH_EXPLICIT_BIT);
		GLU_CHECK_MSG("glMapBufferRange");
		TCU_CHECK(ptr);

		deMemcpy(ptr, refBuf.getPtr(mapOffset), mapSize);

		glFlushMappedBufferRange(m_bufferTarget, sliceAOffs, sliceASize);
		GLU_CHECK_MSG("glFlushMappedBufferRange");
		glFlushMappedBufferRange(m_bufferTarget, sliceBOffs, sliceBSize);
		GLU_CHECK_MSG("glFlushMappedBufferRange");

		glUnmapBuffer(m_bufferTarget);
		GLU_CHECK_MSG("glUnmapBuffer");

		if (m_partialWrite)
		{
			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset+sliceAOffs, sliceASize, m_bufferTarget))
				isOk = false;

			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset+sliceBOffs, sliceBSize, m_bufferTarget))
				isOk = false;
		}
		else
		{
			if (!verifier.verify(buf, refBuf.getPtr(), mapOffset, mapSize, m_bufferTarget))
				isOk = false;
		}

		deleteBuffer(buf);

		m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
								isOk ? "Pass"				: "Buffer verification failed");
		return STOP;
	}